

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int findlabel(LexState *ls,int g)

{
  Dyndata *pDVar1;
  BlockCnt *pBVar2;
  Labeldesc *pLVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  Labeldesc *pLVar7;
  long lVar8;
  
  pDVar1 = ls->dyd;
  pBVar2 = ls->fs->bl;
  pLVar7 = (pDVar1->gt).arr + g;
  lVar6 = (long)pBVar2->firstlabel + -1;
  lVar4 = (long)pBVar2->firstlabel * 0x18 + -0x18;
  do {
    lVar8 = lVar4;
    lVar6 = lVar6 + 1;
    if ((pDVar1->label).n <= lVar6) {
      return 0;
    }
    pLVar3 = (pDVar1->label).arr;
    iVar5 = luaS_eqstr(*(TString **)((long)&pLVar3[1].name + lVar8),pLVar7->name);
    lVar4 = lVar8 + 0x18;
  } while (iVar5 == 0);
  if (((&pLVar3[1].nactvar)[lVar8] < pLVar7->nactvar) &&
     ((pBVar2->upval != '\0' || ((int)pBVar2->firstlabel < (pDVar1->label).n)))) {
    luaK_patchclose(ls->fs,pLVar7->pc,(uint)(&pLVar3[1].nactvar)[lVar8]);
  }
  closegoto(ls,g,(Labeldesc *)((long)&pLVar3[1].name + lVar8));
  return 1;
}

Assistant:

static int findlabel (LexState *ls, int g) {
  int i;
  BlockCnt *bl = ls->fs->bl;
  Dyndata *dyd = ls->dyd;
  Labeldesc *gt = &dyd->gt.arr[g];
  /* check labels in current block for a match */
  for (i = bl->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (luaS_eqstr(lb->name, gt->name)) {  /* correct label? */
      if (gt->nactvar > lb->nactvar &&
          (bl->upval || dyd->label.n > bl->firstlabel))
        luaK_patchclose(ls->fs, gt->pc, lb->nactvar);
      closegoto(ls, g, lb);  /* close it */
      return 1;
    }
  }
  return 0;  /* label not found; cannot close goto */
}